

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void read_film_grain_params(AV1_COMMON *cm,aom_read_bit_buffer *rb)

{
  undefined2 uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int *__dest;
  char *in_RDI;
  int i_6;
  int i_5;
  int i_4;
  int num_pos_chroma;
  int num_pos_luma;
  int i_3;
  int i_2;
  int i_1;
  uint16_t random_seed;
  RefCntBuffer *buf;
  int i;
  int found;
  int film_grain_params_ref_idx;
  SequenceHeader *seq_params;
  aom_film_grain_t *pars;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_3c;
  
  __dest = (int *)(in_RDI + 0x5cc8);
  lVar2 = *(long *)(in_RDI + 0x6088);
  iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  *__dest = iVar4;
  if (*__dest == 0) {
    memset(__dest,0,0x288);
  }
  else {
    iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c);
    *(short *)(in_RDI + 0x5f4c) = (short)iVar4;
    if (*in_RDI == '\x01') {
      iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *(int *)(in_RDI + 0x5ccc) = iVar4;
    }
    else {
      in_RDI[0x5ccc] = '\x01';
      in_RDI[0x5ccd] = '\0';
      in_RDI[0x5cce] = '\0';
      in_RDI[0x5ccf] = '\0';
    }
    *(undefined4 *)(in_RDI + 0x5f40) = *(undefined4 *)(lVar2 + 0x48);
    if (*(int *)(in_RDI + 0x5ccc) == 0) {
      uVar5 = aom_rb_read_literal((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c);
      bVar3 = false;
      for (local_3c = 0; local_3c < 7; local_3c = local_3c + 1) {
        if (uVar5 == *(uint *)(in_RDI + (long)local_3c * 4 + 0xf0)) {
          bVar3 = true;
          break;
        }
      }
      if (!bVar3) {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_UNSUP_BITSTREAM,
                           "Invalid film grain reference idx %d. ref_frame_idx = {%d, %d, %d, %d, %d, %d, %d}"
                           ,(ulong)uVar5,(ulong)*(uint *)(in_RDI + 0xf0),
                           (ulong)*(uint *)(in_RDI + 0xf4),*(undefined4 *)(in_RDI + 0xf8),
                           *(undefined4 *)(in_RDI + 0xfc),*(undefined4 *)(in_RDI + 0x100),
                           *(undefined4 *)(in_RDI + 0x104),*(undefined4 *)(in_RDI + 0x108));
      }
      lVar2 = *(long *)(in_RDI + (long)(int)uVar5 * 8 + 0x1a0);
      if (lVar2 == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_UNSUP_BITSTREAM,
                           "Invalid Film grain reference idx");
      }
      if (*(char *)(lVar2 + 0x238) == '\0') {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_UNSUP_BITSTREAM,
                           "Film grain reference parameters not available");
      }
      uVar1 = *(undefined2 *)(in_RDI + 0x5f4c);
      memcpy(__dest,(void *)(lVar2 + 0x23c),0x288);
      *(undefined2 *)(in_RDI + 0x5f4c) = uVar1;
    }
    else {
      iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c);
      *(int *)(in_RDI + 0x5d40) = iVar4;
      if (0xe < *(int *)(in_RDI + 0x5d40)) {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_UNSUP_BITSTREAM,
                           "Number of points for film grain luma scaling function exceeds the maximum value."
                          );
      }
      for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x5d40); local_50 = local_50 + 1) {
        iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        *(int *)(in_RDI + (long)local_50 * 8 + 0x5cd0) = iVar4;
        if ((local_50 != 0) &&
           (*(int *)(in_RDI + (long)local_50 * 8 + 0x5cd0) <=
            *(int *)(in_RDI + (long)(local_50 + -1) * 8 + 0x5cd0))) {
          aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_UNSUP_BITSTREAM,
                             "First coordinate of the scaling function points shall be increasing.")
          ;
        }
        iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        *(int *)(in_RDI + (long)local_50 * 8 + 0x5cd4) = iVar4;
      }
      if (*(char *)(lVar2 + 0x4d) == '\0') {
        iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        *(int *)(in_RDI + 0x5f44) = iVar4;
      }
      else {
        in_RDI[0x5f44] = '\0';
        in_RDI[0x5f45] = '\0';
        in_RDI[0x5f46] = '\0';
        in_RDI[0x5f47] = '\0';
      }
      if (((*(char *)(lVar2 + 0x4d) == '\0') && (*(int *)(in_RDI + 0x5f44) == 0)) &&
         ((*(int *)(lVar2 + 0x60) != 1 ||
          ((*(int *)(lVar2 + 100) != 1 || (*(int *)(in_RDI + 0x5d40) != 0)))))) {
        iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        *(int *)(in_RDI + 0x5d94) = iVar4;
        if (10 < *(int *)(in_RDI + 0x5d94)) {
          aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_UNSUP_BITSTREAM,
                             "Number of points for film grain cb scaling function exceeds the maximum value."
                            );
        }
        for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x5d94); local_54 = local_54 + 1) {
          iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff6c);
          *(int *)(in_RDI + (long)local_54 * 8 + 0x5d44) = iVar4;
          if ((local_54 != 0) &&
             (*(int *)(in_RDI + (long)local_54 * 8 + 0x5d44) <=
              *(int *)(in_RDI + (long)(local_54 + -1) * 8 + 0x5d44))) {
            aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),
                               AOM_CODEC_UNSUP_BITSTREAM,
                               "First coordinate of the scaling function points shall be increasing."
                              );
          }
          iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff6c);
          *(int *)(in_RDI + (long)local_54 * 8 + 0x5d48) = iVar4;
        }
        iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        *(int *)(in_RDI + 0x5de8) = iVar4;
        if (10 < *(int *)(in_RDI + 0x5de8)) {
          aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_UNSUP_BITSTREAM,
                             "Number of points for film grain cr scaling function exceeds the maximum value."
                            );
        }
        for (local_58 = 0; local_58 < *(int *)(in_RDI + 0x5de8); local_58 = local_58 + 1) {
          iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff6c);
          *(int *)(in_RDI + (long)local_58 * 8 + 0x5d98) = iVar4;
          if ((local_58 != 0) &&
             (*(int *)(in_RDI + (long)local_58 * 8 + 0x5d98) <=
              *(int *)(in_RDI + (long)(local_58 + -1) * 8 + 0x5d98))) {
            aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),
                               AOM_CODEC_UNSUP_BITSTREAM,
                               "First coordinate of the scaling function points shall be increasing."
                              );
          }
          iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff6c);
          *(int *)(in_RDI + (long)local_58 * 8 + 0x5d9c) = iVar4;
        }
        if (((*(int *)(lVar2 + 0x60) == 1) && (*(int *)(lVar2 + 100) == 1)) &&
           (((*(int *)(in_RDI + 0x5d94) == 0 && (*(int *)(in_RDI + 0x5de8) != 0)) ||
            ((*(int *)(in_RDI + 0x5d94) != 0 && (*(int *)(in_RDI + 0x5de8) == 0)))))) {
          aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_UNSUP_BITSTREAM,
                             "In YCbCr 4:2:0, film grain shall be applied to both chroma components or neither."
                            );
        }
      }
      else {
        in_RDI[0x5d94] = '\0';
        in_RDI[0x5d95] = '\0';
        in_RDI[0x5d96] = '\0';
        in_RDI[0x5d97] = '\0';
        in_RDI[0x5de8] = '\0';
        in_RDI[0x5de9] = '\0';
        in_RDI[0x5dea] = '\0';
        in_RDI[0x5deb] = '\0';
      }
      iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c);
      *(int *)(in_RDI + 0x5dec) = iVar4 + 8;
      iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c);
      *(int *)(in_RDI + 0x5df0) = iVar4;
      iVar4 = *(int *)(in_RDI + 0x5df0) * 2 * (*(int *)(in_RDI + 0x5df0) + 1);
      local_60 = iVar4;
      if (0 < *(int *)(in_RDI + 0x5d40)) {
        local_60 = iVar4 + 1;
      }
      if (*(int *)(in_RDI + 0x5d40) != 0) {
        for (local_64 = 0; local_64 < iVar4; local_64 = local_64 + 1) {
          iVar6 = aom_rb_read_literal((aom_read_bit_buffer *)
                                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff6c);
          *(int *)(in_RDI + (long)local_64 * 4 + 0x5df4) = iVar6 + -0x80;
        }
      }
      if ((*(int *)(in_RDI + 0x5d94) != 0) || (*(int *)(in_RDI + 0x5f44) != 0)) {
        for (local_68 = 0; local_68 < local_60; local_68 = local_68 + 1) {
          iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff6c);
          *(int *)(in_RDI + (long)local_68 * 4 + 0x5e54) = iVar4 + -0x80;
        }
      }
      if ((*(int *)(in_RDI + 0x5de8) != 0) || (*(int *)(in_RDI + 0x5f44) != 0)) {
        for (local_6c = 0; local_6c < local_60; local_6c = local_6c + 1) {
          iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff6c);
          *(int *)(in_RDI + (long)local_6c * 4 + 0x5eb8) = iVar4 + -0x80;
        }
      }
      iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c);
      *(int *)(in_RDI + 0x5f1c) = iVar4 + 6;
      iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c);
      *(int *)(in_RDI + 0x5f48) = iVar4;
      if (*(int *)(in_RDI + 0x5d94) != 0) {
        iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        *(int *)(in_RDI + 0x5f20) = iVar4;
        iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        *(int *)(in_RDI + 0x5f24) = iVar4;
        iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        *(int *)(in_RDI + 0x5f28) = iVar4;
      }
      if (*(int *)(in_RDI + 0x5de8) != 0) {
        iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        *(int *)(in_RDI + 0x5f2c) = iVar4;
        iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        *(int *)(in_RDI + 0x5f30) = iVar4;
        iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        *(int *)(in_RDI + 0x5f34) = iVar4;
      }
      iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *(int *)(in_RDI + 0x5f38) = iVar4;
      iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *(int *)(in_RDI + 0x5f3c) = iVar4;
    }
  }
  return;
}

Assistant:

static void read_film_grain_params(AV1_COMMON *cm,
                                   struct aom_read_bit_buffer *rb) {
  aom_film_grain_t *pars = &cm->film_grain_params;
  const SequenceHeader *const seq_params = cm->seq_params;

  pars->apply_grain = aom_rb_read_bit(rb);
  if (!pars->apply_grain) {
    memset(pars, 0, sizeof(*pars));
    return;
  }

  pars->random_seed = aom_rb_read_literal(rb, 16);
  if (cm->current_frame.frame_type == INTER_FRAME)
    pars->update_parameters = aom_rb_read_bit(rb);
  else
    pars->update_parameters = 1;

  pars->bit_depth = seq_params->bit_depth;

  if (!pars->update_parameters) {
    // inherit parameters from a previous reference frame
    int film_grain_params_ref_idx = aom_rb_read_literal(rb, 3);
    // Section 6.8.20: It is a requirement of bitstream conformance that
    // film_grain_params_ref_idx is equal to ref_frame_idx[ j ] for some value
    // of j in the range 0 to REFS_PER_FRAME - 1.
    int found = 0;
    for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
      if (film_grain_params_ref_idx == cm->remapped_ref_idx[i]) {
        found = 1;
        break;
      }
    }
    if (!found) {
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "Invalid film grain reference idx %d. ref_frame_idx = "
                         "{%d, %d, %d, %d, %d, %d, %d}",
                         film_grain_params_ref_idx, cm->remapped_ref_idx[0],
                         cm->remapped_ref_idx[1], cm->remapped_ref_idx[2],
                         cm->remapped_ref_idx[3], cm->remapped_ref_idx[4],
                         cm->remapped_ref_idx[5], cm->remapped_ref_idx[6]);
    }
    RefCntBuffer *const buf = cm->ref_frame_map[film_grain_params_ref_idx];
    if (buf == NULL) {
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "Invalid Film grain reference idx");
    }
    if (!buf->film_grain_params_present) {
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "Film grain reference parameters not available");
    }
    uint16_t random_seed = pars->random_seed;
    *pars = buf->film_grain_params;   // inherit paramaters
    pars->random_seed = random_seed;  // with new random seed
    return;
  }

  // Scaling functions parameters
  pars->num_y_points = aom_rb_read_literal(rb, 4);  // max 14
  if (pars->num_y_points > 14)
    aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                       "Number of points for film grain luma scaling function "
                       "exceeds the maximum value.");
  for (int i = 0; i < pars->num_y_points; i++) {
    pars->scaling_points_y[i][0] = aom_rb_read_literal(rb, 8);
    if (i && pars->scaling_points_y[i - 1][0] >= pars->scaling_points_y[i][0])
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "First coordinate of the scaling function points "
                         "shall be increasing.");
    pars->scaling_points_y[i][1] = aom_rb_read_literal(rb, 8);
  }

  if (!seq_params->monochrome)
    pars->chroma_scaling_from_luma = aom_rb_read_bit(rb);
  else
    pars->chroma_scaling_from_luma = 0;

  if (seq_params->monochrome || pars->chroma_scaling_from_luma ||
      ((seq_params->subsampling_x == 1) && (seq_params->subsampling_y == 1) &&
       (pars->num_y_points == 0))) {
    pars->num_cb_points = 0;
    pars->num_cr_points = 0;
  } else {
    pars->num_cb_points = aom_rb_read_literal(rb, 4);  // max 10
    if (pars->num_cb_points > 10)
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "Number of points for film grain cb scaling function "
                         "exceeds the maximum value.");
    for (int i = 0; i < pars->num_cb_points; i++) {
      pars->scaling_points_cb[i][0] = aom_rb_read_literal(rb, 8);
      if (i &&
          pars->scaling_points_cb[i - 1][0] >= pars->scaling_points_cb[i][0])
        aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                           "First coordinate of the scaling function points "
                           "shall be increasing.");
      pars->scaling_points_cb[i][1] = aom_rb_read_literal(rb, 8);
    }

    pars->num_cr_points = aom_rb_read_literal(rb, 4);  // max 10
    if (pars->num_cr_points > 10)
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "Number of points for film grain cr scaling function "
                         "exceeds the maximum value.");
    for (int i = 0; i < pars->num_cr_points; i++) {
      pars->scaling_points_cr[i][0] = aom_rb_read_literal(rb, 8);
      if (i &&
          pars->scaling_points_cr[i - 1][0] >= pars->scaling_points_cr[i][0])
        aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                           "First coordinate of the scaling function points "
                           "shall be increasing.");
      pars->scaling_points_cr[i][1] = aom_rb_read_literal(rb, 8);
    }

    if ((seq_params->subsampling_x == 1) && (seq_params->subsampling_y == 1) &&
        (((pars->num_cb_points == 0) && (pars->num_cr_points != 0)) ||
         ((pars->num_cb_points != 0) && (pars->num_cr_points == 0))))
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "In YCbCr 4:2:0, film grain shall be applied "
                         "to both chroma components or neither.");
  }

  pars->scaling_shift = aom_rb_read_literal(rb, 2) + 8;  // 8 + value

  // AR coefficients
  // Only sent if the corresponsing scaling function has
  // more than 0 points

  pars->ar_coeff_lag = aom_rb_read_literal(rb, 2);

  int num_pos_luma = 2 * pars->ar_coeff_lag * (pars->ar_coeff_lag + 1);
  int num_pos_chroma = num_pos_luma;
  if (pars->num_y_points > 0) ++num_pos_chroma;

  if (pars->num_y_points)
    for (int i = 0; i < num_pos_luma; i++)
      pars->ar_coeffs_y[i] = aom_rb_read_literal(rb, 8) - 128;

  if (pars->num_cb_points || pars->chroma_scaling_from_luma)
    for (int i = 0; i < num_pos_chroma; i++)
      pars->ar_coeffs_cb[i] = aom_rb_read_literal(rb, 8) - 128;

  if (pars->num_cr_points || pars->chroma_scaling_from_luma)
    for (int i = 0; i < num_pos_chroma; i++)
      pars->ar_coeffs_cr[i] = aom_rb_read_literal(rb, 8) - 128;

  pars->ar_coeff_shift = aom_rb_read_literal(rb, 2) + 6;  // 6 + value

  pars->grain_scale_shift = aom_rb_read_literal(rb, 2);

  if (pars->num_cb_points) {
    pars->cb_mult = aom_rb_read_literal(rb, 8);
    pars->cb_luma_mult = aom_rb_read_literal(rb, 8);
    pars->cb_offset = aom_rb_read_literal(rb, 9);
  }

  if (pars->num_cr_points) {
    pars->cr_mult = aom_rb_read_literal(rb, 8);
    pars->cr_luma_mult = aom_rb_read_literal(rb, 8);
    pars->cr_offset = aom_rb_read_literal(rb, 9);
  }

  pars->overlap_flag = aom_rb_read_bit(rb);

  pars->clip_to_restricted_range = aom_rb_read_bit(rb);
}